

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O1

void __thiscall LLVMBC::StreamState::append(StreamState *this,ExtractValueInst *ext,bool decl)

{
  uint uVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  uint64_t local_40;
  Value *local_38;
  Type *local_30;
  
  if ((int)CONCAT71(in_register_00000011,decl) == 0) {
    local_40 = Value::get_tween_id((Value *)ext);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1c9936,&local_40);
  }
  else {
    local_40 = Value::get_tween_id((Value *)ext);
    local_30 = Value::getType((Value *)ext);
    local_38 = ExtractValueInst::getAggregateOperand(ext);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"%",1);
    append<unsigned_long,char_const(&)[4],char_const(&)[14],LLVMBC::Type*,char_const(&)[2],LLVMBC::Value*>
              (this,&local_40,(char (*) [4])" = ",(char (*) [14])"extractvalue ",&local_30,
               (char (*) [2])0x1c97ea,&local_38);
    uVar1 = ExtractValueInst::getNumIndices(ext);
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
        ExtractValueInst::getIndices(ext);
        std::ostream::_M_insert<unsigned_long>((ulong)this);
        uVar2 = uVar2 + 1;
        uVar1 = ExtractValueInst::getNumIndices(ext);
      } while (uVar2 < uVar1);
    }
  }
  return;
}

Assistant:

void StreamState::append(ExtractValueInst *ext, bool decl)
{
	if (decl)
	{
		append("%", ext->get_tween_id(), " = ", "extractvalue ", ext->getType(), " ", ext->getAggregateOperand());
		for (unsigned i = 0; i < ext->getNumIndices(); i++)
		{
			append(", ");
			append(ext->getIndices()[i]);
		}
	}
	else
	{
		append("%", ext->get_tween_id());
	}
}